

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_pcall(lua_State *L)

{
  int iVar1;
  
  luaL_checkany(L,1);
  lua_pushboolean(L,1);
  lua_rotate(L,1,1);
  iVar1 = lua_gettop(L);
  iVar1 = lua_pcallk(L,iVar1 + -2,-1,0,0,finishpcall);
  iVar1 = finishpcall(L,iVar1,0);
  return iVar1;
}

Assistant:

static int luaB_pcall(lua_State *L) {
    int status;
    luaL_checkany(L, 1);
    lua_pushboolean(L, 1);  /* first result if no errors */
    lua_insert(L, 1);  /* put it in place */
    status = lua_pcallk(L, lua_gettop(L) - 2, LUA_MULTRET, 0, 0, finishpcall);
    return finishpcall(L, status, 0);
}